

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall Network::Network(Network *this,Network_param *param)

{
  Clock *pCVar1;
  Logging *pLVar2;
  undefined8 in_RSI;
  long in_RDI;
  
  std::vector<Synapse_*,_std::allocator<Synapse_*>_>::vector
            ((vector<Synapse_*,_std::allocator<Synapse_*>_> *)0x14ef95);
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  std::vector<Population_*,_std::allocator<Population_*>_>::vector
            ((vector<Population_*,_std::allocator<Population_*>_> *)0x14efb1);
  pCVar1 = Clock::getInstance();
  *(Clock **)(in_RDI + 0x38) = pCVar1;
  pLVar2 = Logging::getInstance();
  *(Logging **)(in_RDI + 0x40) = pLVar2;
  return;
}

Assistant:

Network::Network(Network_param* param) : 
    param(param) 
{
    clock = Clock::getInstance();
    logger = Logging::getInstance();
}